

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O0

bool __thiscall
Circuit::base_circuit
          (Circuit *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *inputs,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *outputs)

{
  value_type vVar1;
  byte bVar2;
  byte bVar3;
  value_type vVar4;
  uint uVar5;
  reference pvVar6;
  size_type sVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  byte *pbVar12;
  runtime_error *prVar13;
  Circuit *in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  uint *in_RDI;
  uint j_2;
  uint i_4;
  uint i_3;
  uint cntOut;
  uint j_1;
  uint i_2;
  uint j;
  uint i_1;
  uint cnt;
  uint i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> W;
  allocator_type *in_stack_ffffffffffffff10;
  Circuit *this_00;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff20;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  Circuit *local_18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x109c7e);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff20,CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
             ,in_stack_ffffffffffffff10);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x109caa);
  for (local_48 = 0; local_48 < *in_RDI; local_48 = local_48 + 1) {
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&local_30,(ulong)local_48);
    *pvVar6 = 0xff;
  }
  local_4c = 0;
  for (local_50 = 0;
      sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2)),
      local_50 < sVar7; local_50 = local_50 + 1) {
    for (local_54 = 0;
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),
                            (ulong)local_50), local_54 < *pvVar8; local_54 = local_54 + 1) {
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_10,(ulong)local_4c);
      vVar1 = *pvVar9;
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&local_30,(ulong)local_4c);
      *pvVar6 = vVar1;
      local_4c = local_4c + 1;
    }
  }
  local_58 = 0;
  do {
    sVar7 = std::vector<GateType,_std::allocator<GateType>_>::size
                      ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe));
    if (sVar7 <= local_58) {
      this_00 = local_18;
      uVar5 = total_num_out(local_18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (in_stack_ffffffffffffff20,CONCAT44(uVar5,in_stack_ffffffffffffff18));
      local_4c = *in_RDI;
      local_60 = 0;
      for (local_64 = 0;
          sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8)),
          local_64 < sVar7; local_64 = local_64 + 1) {
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8),
                            (ulong)local_64);
        local_4c = local_4c - *pvVar8;
      }
      for (local_68 = 0;
          sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8)),
          local_68 < sVar7; local_68 = local_68 + 1) {
        for (local_6c = 0;
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8),
                                (ulong)local_68), local_6c < *pvVar8; local_6c = local_6c + 1) {
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&local_30,(ulong)local_4c);
          vVar1 = *pvVar6;
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_18,
                              (ulong)local_60);
          *pvVar6 = vVar1;
          local_4c = local_4c + 1;
          local_60 = local_60 + 1;
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
      return true;
    }
    pvVar10 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                        ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe),
                         (ulong)local_58);
    if (*pvVar10 != EQ) {
      pvVar11 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)(in_RDI + 0x14),(ulong)local_58);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                (&local_30,(ulong)*pvVar8);
    }
    pvVar10 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                        ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe),
                         (ulong)local_58);
    if (((*pvVar10 != INV) &&
        (pvVar10 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                             ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe),
                              (ulong)local_58), *pvVar10 != EQ)) &&
       (pvVar10 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                            ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe),
                             (ulong)local_58), *pvVar10 != EQW)) {
      local_5c = 1;
      while( true ) {
        pvVar11 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)(in_RDI + 0x1a),(ulong)local_58);
        sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar11);
        if (sVar7 <= local_5c) break;
        pvVar11 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)(in_RDI + 0x14),(ulong)local_58);
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvVar11,(ulong)local_5c);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                  (&local_30,(ulong)*pvVar8);
        local_5c = local_5c + 1;
      }
    }
    pvVar10 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                        ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe),
                         (ulong)local_58);
    if (*pvVar10 == AND) {
      pvVar11 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)(in_RDI + 0x14),(ulong)local_58);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,0);
      pbVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          (&local_30,(ulong)*pvVar8);
      bVar2 = *pbVar12;
      pvVar11 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)(in_RDI + 0x14),(ulong)local_58);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,1);
      pbVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          (&local_30,(ulong)*pvVar8);
      bVar3 = *pbVar12;
      pvVar11 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)(in_RDI + 0x1a),(ulong)local_58);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,0);
      pbVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          (&local_30,(ulong)*pvVar8);
      *pbVar12 = bVar2 & bVar3;
    }
    else {
      pvVar10 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                          ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe),
                           (ulong)local_58);
      if (*pvVar10 == MAND) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar13,"MAND not supported");
        __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar10 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                          ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe),
                           (ulong)local_58);
      if (*pvVar10 == XOR) {
        pvVar11 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)(in_RDI + 0x14),(ulong)local_58);
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,0);
        pbVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (&local_30,(ulong)*pvVar8);
        bVar2 = *pbVar12;
        pvVar11 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)(in_RDI + 0x14),(ulong)local_58);
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,1);
        pbVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (&local_30,(ulong)*pvVar8);
        bVar3 = *pbVar12;
        pvVar11 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)(in_RDI + 0x1a),(ulong)local_58);
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,0);
        pbVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (&local_30,(ulong)*pvVar8);
        *pbVar12 = bVar2 ^ bVar3;
      }
      else {
        pvVar10 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                            ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe),
                             (ulong)local_58);
        if (*pvVar10 == EQ) {
          pvVar11 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  *)(in_RDI + 0x14),(ulong)local_58);
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,0);
          vVar4 = *pvVar8;
          pvVar11 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  *)(in_RDI + 0x1a),(ulong)local_58);
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,0);
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&local_30,(ulong)*pvVar8);
          *pvVar6 = (value_type)vVar4;
        }
        else {
          pvVar10 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                              ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe),
                               (ulong)local_58);
          if (*pvVar10 == EQW) {
            pvVar11 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(in_RDI + 0x14),(ulong)local_58);
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,0)
            ;
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (&local_30,(ulong)*pvVar8);
            vVar1 = *pvVar6;
            pvVar11 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(in_RDI + 0x1a),(ulong)local_58);
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,0)
            ;
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (&local_30,(ulong)*pvVar8);
            *pvVar6 = vVar1;
          }
          else {
            pvVar10 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                                ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe),
                                 (ulong)local_58);
            if (*pvVar10 != INV) {
              prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar13,"not_implemented");
              __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            pvVar11 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(in_RDI + 0x14),(ulong)local_58);
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,0)
            ;
            pbVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (&local_30,(ulong)*pvVar8);
            bVar2 = *pbVar12;
            pvVar11 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(in_RDI + 0x1a),(ulong)local_58);
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,0)
            ;
            pbVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (&local_30,(ulong)*pvVar8);
            *pbVar12 = bVar2 ^ 1;
          }
        }
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

bool Circuit::base_circuit(const vector<uint8_t> &inputs,
                           vector<uint8_t> &outputs) const {
  vector<uint8_t> W(nWires);
  for (unsigned int i = 0; i < nWires; i++) {
    W[i] = -1;
  }

  // Load inputs
  unsigned int cnt = 0;
  for (unsigned int i = 0; i < numI.size(); i++) {
    for (unsigned int j = 0; j < numI[i]; j++) {
      W[cnt] = inputs[cnt];
      cnt++;
    }
  }

  // Evaluate the circuit
  for (unsigned int i = 0; i < GateT.size();
       i++) { // First check if ordering is broken
    if (GateT[i] != EQ && W[GateI[i][0]] < 0) {
      throw std::runtime_error("Circuit error");
    }
    if (GateT[i] != INV && GateT[i] != EQ && GateT[i] != EQW) {
      for (unsigned int j = 1; j < GateO[i].size(); j++) {
        if (W[GateI[i][j]] < 0) {
          throw std::runtime_error("Circuit error");
        }
      }
    }
    // Now evaluate the gate
    if (GateT[i] == AND) {
      W[GateO[i][0]] = W[GateI[i][0]] & W[GateI[i][1]];
    } else if (GateT[i] == MAND) {

      throw std::runtime_error("MAND not supported");
      // for (unsigned int j= 0; j < GateO[i].size(); j++)
      //  {
      //    W[GateO[i][j]]= W[GateI[i][j]] & W[GateI[i][j + GateO[i].size()]];
      //  }
    } else if (GateT[i] == XOR) {
      W[GateO[i][0]] = W[GateI[i][0]] ^ W[GateI[i][1]];
    } else if (GateT[i] == EQ) {
      W[GateO[i][0]] = GateI[i][0];
    } else if (GateT[i] == EQW) {
      W[GateO[i][0]] = W[GateI[i][0]];
    } else if (GateT[i] == INV) {
      W[GateO[i][0]] = 1 ^ W[GateI[i][0]];
    } else {
      throw std::runtime_error("not_implemented");
    }
  }

  // Now produce the output
  outputs.resize(total_num_out());
  cnt = nWires;
  unsigned int cntOut = 0;
  for (unsigned int i = 0; i < numO.size(); i++) {
    cnt -= numO[i];
  }
  for (unsigned int i = 0; i < numO.size(); i++) {
    // outputs[i].resize(numO[i]);
    for (unsigned int j = 0; j < numO[i]; j++) {
      outputs[cntOut] = W[cnt];
      cnt++;
      cntOut++;
    }
  }
  return true;
}